

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O3

void array_suite::test_int_four(void)

{
  oarchive ar;
  int array [4];
  ostringstream result;
  long *local_218 [2];
  long local_208 [2];
  undefined **local_1f8 [6];
  type local_1c8;
  pointer local_1b0;
  pointer local_1a0;
  int local_198 [6];
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1f8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_198[0] = 1;
  local_198[1] = 2;
  local_198[2] = 3;
  local_198[3] = 4;
  trial::protocol::serialization::
  save_overloader<trial::protocol::json::basic_oarchive<char>,_int[4],_void>::save
            ((basic_oarchive<char> *)local_1f8,(int (*) [4])local_198,0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[10]>
            ("result.str()","\"[1,2,3,4]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x123,"void array_suite::test_int_four()",local_218,"[1,2,3,4]");
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_1f8[0] = &PTR_vsave_001248d0;
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0,(long)local_1a0 - (long)local_1b0);
  }
  (**(code **)local_1c8._0_8_)();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_1f8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_int_four()
{
    std::ostringstream result;
    json::oarchive ar(result);
    int array[] = { 1, 2, 3, 4 };
    ar << array;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1,2,3,4]");
}